

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_f32_f16(DisasContext_conflict1 *s,arg_VCVT_f32_f16 *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr arg2;
  _Bool _Var1;
  TCGv_ptr arg2_00;
  TCGv_i32 arg3;
  TCGv_i32 ret;
  long offset;
  TCGv_i32 tmp;
  TCGv_i32 ahp_mode;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_f32_f16 *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fp16_spconv(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      arg2_00 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
      arg3 = get_ahp_flag(tcg_ctx_00);
      ret = tcg_temp_new_i32(tcg_ctx_00);
      arg2 = tcg_ctx_00->cpu_env;
      offset = vfp_f16_offset(a->vm,a->t != 0);
      tcg_gen_ld16u_i32(tcg_ctx_00,ret,arg2,offset);
      gen_helper_vfp_fcvt_f16_to_f32(tcg_ctx_00,ret,ret,arg2_00,arg3);
      neon_store_reg32(tcg_ctx_00,ret,a->vd);
      tcg_temp_free_i32(tcg_ctx_00,arg3);
      tcg_temp_free_ptr(tcg_ctx_00,arg2_00);
      tcg_temp_free_i32(tcg_ctx_00,ret);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_f32_f16(DisasContext *s, arg_VCVT_f32_f16 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i32 ahp_mode;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_fp16_spconv, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    ahp_mode = get_ahp_flag(tcg_ctx);
    tmp = tcg_temp_new_i32(tcg_ctx);
    /* The T bit tells us if we want the low or high 16 bits of Vm */
    tcg_gen_ld16u_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, vfp_f16_offset(a->vm, a->t));
    gen_helper_vfp_fcvt_f16_to_f32(tcg_ctx, tmp, tmp, fpst, ahp_mode);
    neon_store_reg32(tcg_ctx, tmp, a->vd);
    tcg_temp_free_i32(tcg_ctx, ahp_mode);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return true;
}